

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RS232Port.h
# Opt level: O2

int WriteAllRS232Port(RS232PORT *pRS232Port,uint8 *writebuf,int writebuflen)

{
  int iVar1;
  
  if (pRS232Port->DevType - 1U < 4) {
    iVar1 = sendall(pRS232Port->s,(char *)writebuf,writebuflen);
    return iVar1;
  }
  if (pRS232Port->DevType == 0) {
    iVar1 = WriteAllComputerRS232Port(pRS232Port->hDev,writebuf,writebuflen);
    return iVar1;
  }
  return 1;
}

Assistant:

inline int WriteAllRS232Port(RS232PORT* pRS232Port, uint8* writebuf, int writebuflen)
{
	switch (pRS232Port->DevType)
	{
	case TCP_CLIENT_TYPE_RS232PORT:
	case TCP_SERVER_TYPE_RS232PORT:
	case UDP_CLIENT_TYPE_RS232PORT:
	case UDP_SERVER_TYPE_RS232PORT:
		return sendall(pRS232Port->s, (char*)writebuf, writebuflen);
	case LOCAL_TYPE_RS232PORT:
		return WriteAllComputerRS232Port(pRS232Port->hDev, writebuf, (int)writebuflen);
	default:
		PRINT_DEBUG_ERROR_RS232PORT(("WriteAllRS232Port error (%s) : %s"
			"(pRS232Port=%#x, writebuf=%#x, writebuflen=%d)\n", 
			strtime_m(), 
			"Invalid device type. ", 
			pRS232Port, writebuf, writebuflen));
		return EXIT_FAILURE;
	}
}